

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void inline_x25519_ge_dbl_4(ge_p3_4 *r,ge_p3_4 *p,bool skip_t)

{
  uint64_t local_128;
  fe4 cT;
  fe4 cZ;
  fe4 cY;
  fe4 cX;
  fe4 t0;
  fe4 trT;
  fe4 trZ;
  fe4 trX;
  bool skip_t_local;
  ge_p3_4 *p_local;
  ge_p3_4 *r_local;
  
  fe4_sq(trZ + 3,p->X);
  fe4_sq(trT + 3,p->Y);
  fe4_sq(t0 + 3,p->Z);
  fe4_add(t0 + 3,t0 + 3,t0 + 3);
  fe4_add(cZ + 3,p->X,p->Y);
  fe4_sq(cX + 3,cZ + 3);
  fe4_add(cZ + 3,trT + 3,trZ + 3);
  fe4_sub(cT + 3,trT + 3,trZ + 3);
  fe4_sub(cY + 3,cX + 3,cZ + 3);
  fe4_sub(&local_128,t0 + 3,cT + 3);
  fe4_mul(r->X,cY + 3,&local_128);
  fe4_mul(r->Y,cZ + 3,cT + 3);
  fe4_mul(r->Z,cT + 3,&local_128);
  if (!skip_t) {
    fe4_mul(r->T,cY + 3,cZ + 3);
  }
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void inline_x25519_ge_dbl_4(ge_p3_4 *r, const ge_p3_4 *p, bool skip_t) {
  // Transcribed from a Coq function proven against affine coordinates.
  // https://github.com/mit-plv/fiat-crypto/blob/9943ba9e7d8f3e1c0054b2c94a5edca46ea73ef8/src/Curves/Edwards/XYZT/Basic.v#L136-L165
  fe4 trX, trZ, trT, t0, cX, cY, cZ, cT;
  fe4_sq(trX, p->X);
  fe4_sq(trZ, p->Y);
  fe4_sq(trT, p->Z);
  fe4_add(trT, trT, trT);
  fe4_add(cY, p->X, p->Y);
  fe4_sq(t0, cY);
  fe4_add(cY, trZ, trX);
  fe4_sub(cZ, trZ, trX);
  fe4_sub(cX, t0, cY);
  fe4_sub(cT, trT, cZ);
  fe4_mul(r->X, cX, cT);
  fe4_mul(r->Y, cY, cZ);
  fe4_mul(r->Z, cZ, cT);
  if (!skip_t) {
    fe4_mul(r->T, cX, cY);
  }
}